

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_2_5::Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(IStream *in,int *v)

{
  undefined8 in_RAX;
  char b [4];
  
  b = SUB84((ulong)in_RAX >> 0x20,0);
  (*in->_vptr_IStream[3])(in,b,4);
  *v = (int)b;
  return;
}

Assistant:

void
read (T &in, signed int &v)
{
    signed char b[4];

    readSignedChars<S> (in, b, 4);

    v =  (static_cast <unsigned char> (b[0])        & 0x000000ff) |
	((static_cast <unsigned char> (b[1]) << 8)  & 0x0000ff00) |
	((static_cast <unsigned char> (b[2]) << 16) & 0x00ff0000) |
         (static_cast <unsigned char> (b[3]) << 24);
}